

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fdatasync_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req == &fdatasync_req) {
    if (fdatasync_req.fs_type == UV_FS_FDATASYNC) {
      if (fdatasync_req.result == 0) {
        fdatasync_cb_count = fdatasync_cb_count + 1;
        uv_fs_req_cleanup(&fdatasync_req);
        iVar1 = uv_fs_fsync(loop,&fsync_req,(undefined4)open_req1.result,fsync_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x1dd;
      }
      else {
        pcVar3 = "req->result == 0";
        uVar2 = 0x1d9;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_FDATASYNC";
      uVar2 = 0x1d8;
    }
  }
  else {
    pcVar3 = "req == &fdatasync_req";
    uVar2 = 0x1d7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fdatasync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fdatasync_req);
  ASSERT(req->fs_type == UV_FS_FDATASYNC);
  ASSERT(req->result == 0);
  fdatasync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_fsync(loop, &fsync_req, open_req1.result, fsync_cb);
  ASSERT(r == 0);
}